

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cc
# Opt level: O3

int board::evaluate::score(Board *pos)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int (*paiVar15) [10];
  int iVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  
  if (((((pos->pNum[4] == 0) && (pos->pNum[10] == 0)) && (pos->pNum[5] == 0)) &&
      ((pos->pNum[0xb] == 0 && (pos->pNum[1] == 0)))) && (pos->pNum[7] == 0)) {
    iVar8 = pos->pNum[9];
    iVar6 = pos->pNum[3];
    if (iVar8 == 0 && iVar6 == 0) {
      if (pos->pNum[2] < 3 && pos->pNum[8] < 3) {
        return 0;
      }
      iVar16 = pos->material[0];
      iVar13 = pos->material[1];
      iVar6 = iVar16 - iVar13;
      goto LAB_001347aa;
    }
    if (pos->pNum[2] == 0 && pos->pNum[8] == 0) {
      uVar14 = iVar6 - iVar8;
      uVar17 = -uVar14;
      if (0 < (int)uVar14) {
        uVar17 = uVar14;
      }
      if (uVar17 < 2) {
        return 0;
      }
    }
  }
  else {
    iVar6 = pos->pNum[3];
    iVar8 = pos->pNum[9];
  }
  iVar16 = pos->material[0];
  iVar13 = pos->material[1];
  iVar19 = (iVar16 - iVar13) + 0x1e;
  if (iVar6 != 2) {
    iVar19 = iVar16 - iVar13;
  }
  iVar6 = iVar19 + -0x1e;
  if (iVar8 != 2) {
    iVar6 = iVar19;
  }
LAB_001347aa:
  paiVar15 = pos->pList;
  lVar18 = 1;
  do {
    paiVar15 = paiVar15 + 1;
    if (0 < (long)pos->pNum[lVar18]) {
      iVar8 = Board::PIECE_COLOR[lVar18];
      uVar20 = (ulong)iVar8;
      bVar21 = uVar20 == 0;
      iVar19 = -5;
      if (bVar21) {
        iVar19 = 5;
      }
      iVar9 = -3;
      if (bVar21) {
        iVar9 = 3;
      }
      iVar10 = -10;
      if (bVar21) {
        iVar10 = 10;
      }
      iVar11 = 10;
      if (bVar21) {
        iVar11 = -10;
      }
      iVar1 = Board::PIECE_NO_TEAM[lVar18];
      lVar12 = 0;
      do {
        iVar4 = (*paiVar15)[lVar12];
        lVar7 = (long)Board::SQ64[iVar4];
        if (iVar8 == 0) {
          iVar3 = *(int *)(PIECE_SQUARE_TABLE + lVar7 * 4 + (long)iVar1 * 0x100);
        }
        else {
          iVar3 = -*(int *)(PIECE_SQUARE_TABLE +
                           (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + lVar7 * 4) * 4 +
                           (long)iVar1 * 0x100);
        }
        iVar6 = iVar6 + iVar3;
        if ((int)lVar18 == 0xc) {
          if (iVar16 < 0x44c && pos->pNum[5] == 0) {
            puVar5 = PIECE_SQUARE_TABLE_KING_END;
          }
          else {
            puVar5 = PIECE_SQUARE_TABLE_KING_OPENING;
          }
          iVar6 = iVar6 - *(int *)(puVar5 + (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + lVar7 * 4) *
                                            4);
        }
        else if ((int)lVar18 == 6) {
          if (iVar13 < 0x44c && pos->pNum[0xb] == 0) {
            puVar5 = PIECE_SQUARE_TABLE_KING_END;
          }
          else {
            puVar5 = PIECE_SQUARE_TABLE_KING_OPENING;
          }
          iVar6 = iVar6 + *(int *)(puVar5 + lVar7 * 4);
        }
        else if (iVar1 == 5) {
          uVar2 = Board::FILE_MASK[Board::FILES[iVar4]];
          iVar4 = iVar9;
          if ((pos->pawns[2] == 0) && ((uVar2 & 1) != 0)) {
            iVar6 = iVar6 + iVar19;
          }
          else {
LAB_00134a1d:
            if ((uVar2 & 1) == 0) {
              iVar4 = 0;
            }
            if (pos->pawns[uVar20] != 0) {
              iVar4 = 0;
            }
            iVar6 = iVar6 + iVar4;
          }
        }
        else if (iVar1 == 4) {
          uVar2 = Board::FILE_MASK[Board::FILES[iVar4]];
          iVar4 = iVar19;
          if ((pos->pawns[2] != 0) || ((uVar2 & 1) == 0)) goto LAB_00134a1d;
          iVar6 = iVar6 + iVar10;
        }
        else if (iVar1 == 1) {
          iVar3 = iVar11;
          if ((Board::ISOLATED_PAWN_MASK[lVar7] & 1) == 0) {
            iVar3 = 0;
          }
          if (pos->pawns[uVar20] != 0) {
            iVar3 = 0;
          }
          iVar6 = iVar6 + iVar3;
          if ((pos->pawns[uVar20 ^ 1] == 0) && ((Board::PASSED_PAWN_MASK[uVar20][lVar7] & 1) != 0))
          {
            iVar3 = -*(int *)(PASSED_PAWN + (long)Board::RANKS[iVar4] * 4);
            if (iVar8 == 0) {
              iVar3 = *(int *)(PASSED_PAWN + (long)Board::RANKS[iVar4] * 4);
            }
            iVar6 = iVar6 + iVar3;
          }
        }
        lVar12 = lVar12 + 1;
      } while (pos->pNum[lVar18] != lVar12);
    }
    lVar18 = lVar18 + 1;
    if (lVar18 == 0xd) {
      iVar8 = -iVar6;
      if (pos->side != 1) {
        iVar8 = iVar6;
      }
      return iVar8;
    }
  } while( true );
}

Assistant:

inline bool board::evaluate::materialDraw(Board& pos)
{
    if (!pos.getPieceNum(WR) && !pos.getPieceNum(BR) && !pos.getPieceNum(WQ) && !pos.getPieceNum(BQ) &&
        !pos.getPieceNum(WP) && !pos.getPieceNum(BP)) {
        if (!pos.getPieceNum(BB) && !pos.getPieceNum(WB)) {
            if (pos.getPieceNum(WN) < 3 && pos.getPieceNum(BN) < 3) {
                return true;
            }
        }
        else if (!pos.getPieceNum(WN) && !pos.getPieceNum(BN)) {
            if (abs(pos.getPieceNum(WB) - pos.getPieceNum(BB)) < 2) {
                return true;
            }
        }
    }
    return false;
}